

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileIsExecutable(string *inName)

{
  bool bVar1;
  undefined1 local_11;
  string *inName_local;
  
  bVar1 = FileIsDirectory(inName);
  local_11 = false;
  if (!bVar1) {
    local_11 = TestFileAccess(inName,1);
  }
  return local_11;
}

Assistant:

bool SystemTools::FileIsExecutable(const std::string& inName)
{
#ifdef _WIN32
  char local_buffer[KWSYS_SYSTEMTOOLS_MAXPATH];
  std::string string_buffer;
  const auto name = RemoveTrailingSlashes(inName, local_buffer, string_buffer);
  const auto attr =
    GetFileAttributesW(Encoding::ToWindowsExtendedPath(name).c_str());

  // On Windows any file that exists and is not a directory is considered
  // readable and therefore also executable:
  return attr != INVALID_FILE_ATTRIBUTES && !(attr & FILE_ATTRIBUTE_DIRECTORY);
#else
  return !FileIsDirectory(inName) && TestFileAccess(inName, TEST_FILE_EXECUTE);
#endif
}